

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O3

void brotli::CreateBackwardReferences<brotli::HashLongestMatch<15,8,16>>
               (size_t num_bytes,size_t position,bool is_last,uint8_t *ringbuffer,
               size_t ringbuffer_mask,int quality,int lgwin,HashLongestMatch<15,_8,_16> *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ushort uVar1;
  uint16_t uVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  size_t insertlen;
  long lVar15;
  size_t best_len;
  ulong local_e8;
  Command *local_e0;
  uint8_t *local_d8;
  long local_d0;
  ulong local_c8;
  double best_score;
  size_t best_dist;
  size_t best_len_code;
  size_t local_a8;
  double best_score_2;
  size_t best_dist_2;
  size_t best_len_code_2;
  ulong local_88;
  ulong local_80;
  uint8_t *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  size_t local_58;
  long local_50;
  Command cmd;
  
  if ((num_bytes < 0x201 && is_last) && position == 0) {
    if (num_bytes == 0) goto LAB_0016d198;
    sVar4 = 0;
    do {
      hasher->num_[(uint)(*(int *)(ringbuffer + sVar4) * 0x1e35a7bd) >> 0x11] = 0;
      hasher->need_init_ = false;
      sVar4 = sVar4 + 1;
    } while (num_bytes != sVar4);
  }
  else if (hasher->need_init_ == true) {
    memset(hasher,0,0x10000);
    hasher->need_init_ = false;
  }
  if (2 < position && 2 < num_bytes) {
    uVar8 = (uint)(*(int *)(ringbuffer + (position - 3 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar1 = hasher->num_[uVar8];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0xff) * 4 + (ulong)(uVar8 << 10)) =
         (int)(position - 3);
    hasher->num_[uVar8] = uVar1 + 1;
    uVar8 = (uint)(*(int *)(ringbuffer + (position - 2 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar1 = hasher->num_[uVar8];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0xff) * 4 + (ulong)(uVar8 << 10)) =
         (int)(position - 2);
    hasher->num_[uVar8] = uVar1 + 1;
    uVar8 = (uint)(*(int *)(ringbuffer + (position - 1 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar1 = hasher->num_[uVar8];
    *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0xff) * 4 + (ulong)(uVar8 << 10)) =
         (int)(position - 1);
    hasher->num_[uVar8] = uVar1 + 1;
  }
LAB_0016d198:
  sVar4 = *last_insert_len;
  uVar10 = ringbuffer_mask & position;
  local_e8 = num_bytes + uVar10;
  local_60 = 0x200;
  if (quality < 9) {
    local_60 = 0x40;
  }
  if (uVar10 + 3 < local_e8) {
    local_c8 = (ulong)((1 << ((byte)lgwin & 0x1f)) + -0x10);
    lVar14 = position - uVar10;
    uVar12 = local_60 + uVar10;
    local_68 = (ulong)(uint)((int)local_60 * 4);
    local_80 = local_e8 - 3;
    local_88 = local_e8 - 4;
    local_d0 = lVar14 + 1;
    local_50 = (uVar10 - 1) + num_bytes;
    local_70 = lVar14 + 2;
    local_78 = ringbuffer + 2;
    local_e0 = commands;
    uVar6 = uVar10;
    local_d8 = ringbuffer;
    local_a8 = ringbuffer_mask;
    do {
      uVar10 = lVar14 + uVar6;
      uVar7 = local_c8;
      if (uVar10 < local_c8) {
        uVar7 = uVar10;
      }
      best_len = 0;
      best_len_code = 0;
      best_dist = 0;
      best_score = 4.0;
      bVar3 = HashLongestMatch<15,_8,_16>::FindLongestMatch
                        (hasher,local_d8,ringbuffer_mask,dist_cache,uVar10 & 0xffffffff,
                         local_e8 - uVar6,uVar7,&best_len,&best_len_code,&best_dist,&best_score);
      if (bVar3) {
        local_58 = sVar4 + 4;
        lVar5 = local_d0 + uVar6;
        lVar11 = -uVar6;
        lVar15 = 0;
        sVar13 = best_len;
        do {
          best_len = sVar13;
          uVar10 = local_50 + lVar11;
          cmd._0_8_ = best_len - 1;
          if (uVar10 < best_len - 1) {
            cmd._0_8_ = uVar10;
          }
          if (4 < quality) {
            cmd._0_8_ = 0;
          }
          best_len_code_2 = 0;
          best_dist_2 = 0;
          best_score_2 = 4.0;
          uVar6 = lVar5 + lVar15;
          uVar12 = local_c8;
          if (uVar6 < local_c8) {
            uVar12 = uVar6;
          }
          bVar3 = HashLongestMatch<15,_8,_16>::FindLongestMatch
                            (hasher,local_d8,local_a8,dist_cache,uVar6 & 0xffffffff,uVar10,uVar12,
                             (size_t *)&cmd,&best_len_code_2,&best_dist_2,&best_score_2);
          ringbuffer_mask = local_a8;
          if ((!bVar3) || (best_score_2 < best_score + 7.0)) {
            insertlen = sVar4 + lVar15;
            break;
          }
          sVar13._0_4_ = cmd.insert_len_;
          sVar13._4_4_ = cmd.copy_len_;
          best_len._0_4_ = cmd.insert_len_;
          best_len._4_4_ = cmd.copy_len_;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          lVar11 = lVar11 + -1;
          lVar15 = lVar15 + 1;
          insertlen = local_58;
        } while ((int)lVar15 != 4);
        sVar4 = best_len;
        lVar11 = -lVar11;
        uVar10 = lVar14 + lVar11;
        if (local_c8 <= (ulong)(lVar14 + lVar11)) {
          uVar10 = local_c8;
        }
        if (uVar10 < best_dist) {
LAB_0016d42d:
          sVar13 = best_dist + 0xf;
LAB_0016d431:
          if (sVar13 != 0 && best_dist <= uVar10) {
            dist_cache[3] = dist_cache[2];
            *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
            *dist_cache = (int)best_dist;
          }
        }
        else {
          if (best_dist != (long)*dist_cache) {
            sVar13 = 1;
            if (((best_dist != (long)dist_cache[1]) &&
                (sVar13 = 2, best_dist != (long)dist_cache[2])) &&
               (sVar13 = 3, best_dist != (long)dist_cache[3])) {
              if (5 < best_dist && 3 < quality) {
                sVar13 = 4;
                do {
                  if ((best_dist ==
                       (long)(int)(&kDistanceCacheOffset)[sVar13] +
                       (long)dist_cache[(uint)(&kDistanceCacheIndex)[sVar13]]) &&
                     (*(ulong *)(ComputeDistanceCode(unsigned_long,unsigned_long,int,int_const*)::
                                 kLimits + sVar13 * 8) <= best_dist)) goto LAB_0016d431;
                  sVar13 = sVar13 + 1;
                } while (sVar13 != 0x10);
              }
              goto LAB_0016d42d;
            }
            goto LAB_0016d431;
          }
          sVar13 = 0;
        }
        Command::Command(&cmd,insertlen,best_len,best_len_code,sVar13);
        local_e0->dist_extra_ = cmd.dist_extra_;
        local_e0->cmd_prefix_ = cmd.cmd_prefix_;
        local_e0->dist_prefix_ = cmd.dist_prefix_;
        local_e0->insert_len_ = cmd.insert_len_;
        local_e0->copy_len_ = cmd.copy_len_;
        local_e0->cmd_extra_ = cmd.cmd_extra_;
        *num_literals = *num_literals + insertlen;
        if (2 < best_len) {
          lVar5 = 0;
          do {
            uVar8 = (uint)(*(int *)(local_78 + lVar5 + lVar11) * 0x1e35a7bd) >> 0x11;
            uVar2 = hasher->num_[uVar8];
            *(int *)((long)hasher->buckets_[0] + (ulong)(byte)uVar2 * 4 + (ulong)(uVar8 << 10)) =
                 (int)local_70 + (int)lVar11 + (int)lVar5;
            hasher->num_[uVar8] = uVar2 + 1;
            lVar5 = lVar5 + 1;
          } while (best_len - 2 != lVar5);
        }
        uVar12 = local_60 + lVar11 + sVar4 * 2;
        local_e0 = local_e0 + 1;
        uVar10 = best_len + lVar11;
        sVar4 = 0;
      }
      else {
        sVar4 = sVar4 + 1;
        uVar10 = uVar6 + 1;
        if (uVar12 < uVar10) {
          if (local_68 + uVar12 < uVar10) {
            uVar7 = uVar6 + 0x11;
            if (local_88 < uVar6 + 0x11) {
              uVar7 = local_88;
            }
            if (uVar10 < uVar7) {
              iVar9 = (int)uVar6 + (int)local_d0;
              do {
                uVar8 = (uint)(*(int *)(local_d8 + uVar10) * 0x1e35a7bd) >> 0x11;
                uVar2 = hasher->num_[uVar8];
                *(int *)((long)hasher->buckets_[0] + (ulong)(byte)uVar2 * 4 + (ulong)(uVar8 << 10))
                     = iVar9;
                hasher->num_[uVar8] = uVar2 + 1;
                sVar4 = sVar4 + 4;
                uVar10 = uVar10 + 4;
                iVar9 = iVar9 + 4;
              } while (uVar10 < uVar7);
            }
          }
          else {
            uVar7 = uVar6 + 9;
            if (local_80 < uVar6 + 9) {
              uVar7 = local_80;
            }
            if (uVar10 < uVar7) {
              iVar9 = (int)uVar6 + (int)local_d0;
              do {
                uVar8 = (uint)(*(int *)(local_d8 + uVar10) * 0x1e35a7bd) >> 0x11;
                uVar2 = hasher->num_[uVar8];
                *(int *)((long)hasher->buckets_[0] + (ulong)(byte)uVar2 * 4 + (ulong)(uVar8 << 10))
                     = iVar9;
                hasher->num_[uVar8] = uVar2 + 1;
                sVar4 = sVar4 + 2;
                uVar10 = uVar10 + 2;
                iVar9 = iVar9 + 2;
              } while (uVar10 < uVar7);
            }
          }
        }
      }
      uVar6 = uVar10;
    } while (uVar10 + 3 < local_e8);
  }
  else {
    local_e0 = commands;
  }
  *last_insert_len = (local_e8 - uVar10) + sVar4;
  *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 3) * -0x5555555555555555;
  return;
}

Assistant:

void CreateBackwardReferences(size_t num_bytes,
                              size_t position,
                              bool is_last,
                              const uint8_t* ringbuffer,
                              size_t ringbuffer_mask,
                              const int quality,
                              const int lgwin,
                              Hasher* hasher,
                              int* dist_cache,
                              size_t* last_insert_len,
                              Command* commands,
                              size_t* num_commands,
                              size_t* num_literals) {
  // Set maximum distance, see section 9.1. of the spec.
  const size_t max_backward_limit = (1 << lgwin) - 16;

  // Choose which init method is faster.
  // memset is about 100 times faster than hasher->InitForData().
  const size_t kMaxBytesForPartialHashInit = Hasher::kHashMapSize >> 7;
  if (position == 0 && is_last && num_bytes <= kMaxBytesForPartialHashInit) {
    hasher->InitForData(ringbuffer, num_bytes);
  } else {
    hasher->Init();
  }
  if (num_bytes >= 3 && position >= 3) {
    // Prepare the hashes for three last bytes of the last write.
    // These could not be calculated before, since they require knowledge
    // of both the previous and the current block.
    hasher->Store(&ringbuffer[(position - 3) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 3));
    hasher->Store(&ringbuffer[(position - 2) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 2));
    hasher->Store(&ringbuffer[(position - 1) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 1));
  }
  const Command * const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  size_t i = position & ringbuffer_mask;
  const size_t i_diff = position - i;
  const size_t i_end = i + num_bytes;

  // For speed up heuristics for random data.
  const size_t random_heuristics_window_size = quality < 9 ? 64 : 512;
  size_t apply_random_heuristics = i + random_heuristics_window_size;

  // Minimum score to accept a backward reference.
  const int kMinScore = 4.0;

  while (i + Hasher::kHashTypeLength - 1 < i_end) {
    size_t max_length = i_end - i;
    size_t max_distance = std::min(i + i_diff, max_backward_limit);
    size_t best_len = 0;
    size_t best_len_code = 0;
    size_t best_dist = 0;
    double best_score = kMinScore;
    bool match_found = hasher->FindLongestMatch(
        ringbuffer, ringbuffer_mask,
        dist_cache, static_cast<uint32_t>(i + i_diff), max_length, max_distance,
        &best_len, &best_len_code, &best_dist, &best_score);
    if (match_found) {
      // Found a match. Let's look for something even better ahead.
      int delayed_backward_references_in_row = 0;
      for (;;) {
        --max_length;
        size_t best_len_2 =
            quality < 5 ? std::min(best_len - 1, max_length) : 0;
        size_t best_len_code_2 = 0;
        size_t best_dist_2 = 0;
        double best_score_2 = kMinScore;
        max_distance = std::min(i + i_diff + 1, max_backward_limit);
        match_found = hasher->FindLongestMatch(
            ringbuffer, ringbuffer_mask,
            dist_cache, static_cast<uint32_t>(i + i_diff + 1),
            max_length, max_distance,
            &best_len_2, &best_len_code_2, &best_dist_2, &best_score_2);
        double cost_diff_lazy = 7.0;
        if (match_found && best_score_2 >= best_score + cost_diff_lazy) {
          // Ok, let's just write one byte for now and start a match from the
            // next byte.
          ++i;
          ++insert_length;
          best_len = best_len_2;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          if (++delayed_backward_references_in_row < 4) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          i + 2 * best_len + random_heuristics_window_size;
      max_distance = std::min(i + i_diff, max_backward_limit);
      // The first 16 codes are special shortcodes, and the minimum offset is 1.
      size_t distance_code =
          ComputeDistanceCode(best_dist, max_distance, quality, dist_cache);
      if (best_dist <= max_distance && distance_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = static_cast<int>(best_dist);
      }
      Command cmd(insert_length, best_len, best_len_code, distance_code);
      *commands++ = cmd;
      *num_literals += insert_length;
      insert_length = 0;
      // Put the hash keys into the table, if there are enough
      // bytes left.
      for (size_t j = 2; j < best_len; ++j) {
        hasher->Store(&ringbuffer[i + j],
                      static_cast<uint32_t>(i + i_diff + j));
      }
      i += best_len;
    } else {
      ++insert_length;
      ++i;
      // If we have not seen matches for a long time, we can skip some
      // match lookups. Unsuccessful match lookups are very very expensive
      // and this kind of a heuristic speeds up compression quite
      // a lot.
      if (i > apply_random_heuristics) {
        // Going through uncompressible data, jump.
        if (i > apply_random_heuristics + 4 * random_heuristics_window_size) {
          // It is quite a long time since we saw a copy, so we assume
          // that this data is not compressible, and store hashes less
          // often. Hashes of non compressible data are less likely to
          // turn out to be useful in the future, too, so we store less of
          // them to not to flood out the hash table of good compressible
          // data.
          size_t i_jump = std::min(i + 16, i_end - 4);
          for (; i < i_jump; i += 4) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 4;
          }
        } else {
          size_t i_jump = std::min(i + 8, i_end - 3);
          for (; i < i_jump; i += 2) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += i_end - i;
  *last_insert_len = insert_length;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}